

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  MessageType t;
  string message;
  string local_88;
  cmMessageCommand *local_68;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar2) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_003eb836;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)pbVar2);
    local_68 = this;
    if (iVar7 == 0) {
      t = FATAL_ERROR;
      goto LAB_003eb778;
    }
    iVar7 = std::__cxx11::string::compare((char *)pbVar2);
    if (iVar7 == 0) {
      bVar5 = true;
      t = FATAL_ERROR;
LAB_003eb760:
      local_40.Begin._M_current = pbVar2 + 1;
      bVar6 = false;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)pbVar2);
      if (iVar7 == 0) {
        t = WARNING;
LAB_003eb778:
        local_40.Begin._M_current = pbVar2 + 1;
        bVar6 = false;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar7 == 0) {
          t = AUTHOR_WARNING;
          goto LAB_003eb778;
        }
        iVar7 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar7 == 0) {
          local_40.Begin._M_current = pbVar2 + 1;
          bVar6 = true;
          t = MESSAGE;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar2);
          if (iVar7 == 0) {
            pcVar4 = (this->super_cmCommand).Makefile;
            paVar1 = &local_88.field_2;
            local_88._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"CMAKE_ERROR_DEPRECATED","");
            bVar5 = cmMakefile::IsOn(pcVar4,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar1) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            t = DEPRECATION_ERROR;
            if (!bVar5) {
              pcVar4 = (local_68->super_cmCommand).Makefile;
              local_88._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"CMAKE_WARN_DEPRECATED","");
              bVar6 = cmMakefile::IsOn(pcVar4,&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar1) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              t = DEPRECATION_WARNING;
              if (!bVar6) goto LAB_003eb836;
            }
            goto LAB_003eb760;
          }
          t = MESSAGE;
          bVar6 = false;
          local_40.Begin._M_current = pbVar2;
        }
      }
      bVar5 = false;
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_58 = 0;
    local_50 = '\0';
    local_60 = &local_50;
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_88,&local_40,&local_50);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    if (t == MESSAGE) {
      if (bVar6) {
        cmMakefile::DisplayStatus
                  ((local_68->super_cmCommand).Makefile,local_88._M_dataplus._M_p,-1.0);
      }
      else {
        cmSystemTools::Message(local_88._M_dataplus._M_p,(char *)0x0);
      }
    }
    else {
      cmMakefile::IssueMessage((local_68->super_cmCommand).Makefile,t,&local_88);
    }
    if (bVar5 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_003eb836;
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
LAB_003eb836:
  return pbVar3 != pbVar2;
}

Assistant:

bool cmMessageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR")
    {
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "FATAL_ERROR")
    {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "WARNING")
    {
    type = cmake::WARNING;
    ++i;
    }
  else if (*i == "AUTHOR_WARNING")
    {
    type = cmake::AUTHOR_WARNING;
    ++i;
    }
  else if (*i == "STATUS")
    {
    status = true;
    ++i;
    }
  else if (*i == "DEPRECATION")
    {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED"))
      {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
      }
    else if (this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))
      {
      type = cmake::DEPRECATION_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }

  std::string message = cmJoin(cmRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE)
    {
    this->Makefile->IssueMessage(type, message);
    }
  else
    {
    if (status)
      {
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    else
      {
      cmSystemTools::Message(message.c_str());
      }
    }
  if(fatal)
    {
    cmSystemTools::SetFatalErrorOccured();
    }
  return true;
}